

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Int16_To_Int8_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  bool bVar1;
  char *dest;
  PaInt16 *src;
  PaUtilTriangularDitherGenerator *ditherGenerator_local;
  uint count_local;
  int sourceStride_local;
  void *sourceBuffer_local;
  int destinationStride_local;
  void *destinationBuffer_local;
  
  count_local = count;
  do {
    bVar1 = count_local != 0;
    count_local = count_local - 1;
  } while (bVar1);
  return;
}

Assistant:

static void Int16_To_Int8_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    PaInt16 *src = (PaInt16*)sourceBuffer;
    signed char *dest =  (signed char*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        /* IMPLEMENT ME */

        src += sourceStride;
        dest += destinationStride;
    }
}